

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::extendWordwiseSelection
          (QWidgetTextControlPrivate *this,int suggestedNewPosition,qreal mouseXPosition)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MoveMode MVar6;
  Int IVar7;
  QWidgetTextControl *pQVar8;
  ulong uVar9;
  MoveMode in_ESI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  QWidgetTextControlPrivate *this_00;
  qreal qVar10;
  double dVar11;
  qreal qVar12;
  QTextLine QVar13;
  qreal differenceToEnd;
  qreal differenceToStart;
  qreal wordEndX;
  int wordEndPos;
  qreal wordStartX;
  int blockPos;
  int wordStartPos;
  QWidgetTextControl *q;
  QTextLine otherLine;
  QTextLine line;
  QPointF blockCoordinates;
  QTextCursor curs;
  QTextCursor *in_stack_fffffffffffffeb8;
  Edge edge;
  QTextLine *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QWidgetTextControlPrivate *in_stack_fffffffffffffed0;
  QTextCursor *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QWidgetTextControl *in_stack_fffffffffffffee8;
  undefined1 forceEmitSelectionChanged;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_84;
  undefined1 *local_80;
  QTextEngine *local_78;
  undefined1 *local_70;
  QTextEngine *local_68;
  undefined1 local_60 [32];
  QPointF local_40;
  undefined1 *local_30;
  undefined1 local_28 [32];
  long local_8;
  
  edge = (Edge)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = q_func(in_RDI);
  iVar2 = QTextCursor::selectionStart();
  if (((int)in_ESI < iVar2) || (iVar2 = QTextCursor::selectionEnd(), iVar2 < (int)in_ESI)) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_30,&in_RDI->selectedWordOnDoubleClick);
    QTextCursor::setPosition((int)&local_30,in_ESI);
    uVar9 = QTextCursor::movePosition((MoveOperation)&local_30,5,0);
    if ((uVar9 & 1) != 0) {
      iVar2 = QTextCursor::position();
      QTextCursor::block();
      QTextBlock::position();
      local_40.yp = -NAN;
      local_40.xp = -NAN;
      QTextCursor::block();
      (**(code **)(*(long *)pQVar8 + 0x80))(local_60,pQVar8,local_28);
      local_40 = QRectF::topLeft((QRectF *)
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
      QVar13 = currentTextLine(in_stack_fffffffffffffed8);
      local_68 = QVar13.eng;
      local_70 = (undefined1 *)CONCAT44(local_70._4_4_,QVar13.index);
      bVar1 = QTextLine::isValid((QTextLine *)&local_70);
      if (bVar1) {
        QTextCursor::position();
        this_00 = (QWidgetTextControlPrivate *)
                  QTextLine::cursorToX(in_stack_fffffffffffffec0,in_stack_fffffffffffffecc,edge);
        qVar10 = QPointF::x(&local_40);
        dVar11 = (double)this_00 + qVar10;
        uVar9 = QTextCursor::movePosition((MoveOperation)&local_30,0xe,0);
        if ((uVar9 & 1) != 0) {
          iVar3 = QTextCursor::position();
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
          QVar13 = currentTextLine(in_stack_fffffffffffffed8);
          local_78 = QVar13.eng;
          local_80 = (undefined1 *)CONCAT44(local_80._4_4_,QVar13.index);
          iVar4 = QTextLine::textStart();
          iVar5 = QTextLine::textStart();
          if ((iVar4 == iVar5) && (iVar3 != iVar2)) {
            QTextCursor::position();
            forceEmitSelectionChanged = (undefined1)((uint)iVar4 >> 0x18);
            qVar10 = QTextLine::cursorToX(in_stack_fffffffffffffec0,in_stack_fffffffffffffecc,edge);
            qVar12 = QPointF::x(&local_40);
            if (((in_RDI->wordSelectionEnabled & 1U) != 0) ||
               ((dVar11 <= in_XMM0_Qa && (in_XMM0_Qa <= qVar10 + qVar12)))) {
              if ((in_RDI->wordSelectionEnabled & 1U) == 0) {
                iVar2 = QTextCursor::position();
                if ((int)in_ESI < iVar2) {
                  in_stack_fffffffffffffec0 = (QTextLine *)&in_RDI->cursor;
                  MVar6 = QTextCursor::selectionEnd();
                  QTextCursor::setPosition((int)in_stack_fffffffffffffec0,MVar6);
                }
                else {
                  in_stack_fffffffffffffeb8 = &in_RDI->cursor;
                  MVar6 = QTextCursor::selectionStart();
                  QTextCursor::setPosition((int)in_stack_fffffffffffffeb8,MVar6);
                }
                edge = (Edge)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
                iVar2 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
                if ((qVar10 + qVar12) - in_XMM0_Qa <= in_XMM0_Qa - dVar11) {
                  setCursorPosition((QWidgetTextControlPrivate *)
                                    CONCAT44(in_ESI,in_stack_fffffffffffffec8),iVar2,
                                    (MoveMode)in_stack_fffffffffffffec0);
                }
                else {
                  setCursorPosition((QWidgetTextControlPrivate *)
                                    CONCAT44(in_ESI,in_stack_fffffffffffffec8),iVar2,
                                    (MoveMode)in_stack_fffffffffffffec0);
                }
              }
              else {
                iVar2 = QTextCursor::position();
                if ((int)in_ESI < iVar2) {
                  iVar2 = (int)in_RDI + 0x88;
                  MVar6 = QTextCursor::selectionEnd();
                  QTextCursor::setPosition(iVar2,MVar6);
                  setCursorPosition((QWidgetTextControlPrivate *)
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                    (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                                    (MoveMode)in_stack_fffffffffffffec0);
                }
                else {
                  in_stack_fffffffffffffed0 = (QWidgetTextControlPrivate *)&in_RDI->cursor;
                  MVar6 = QTextCursor::selectionStart();
                  QTextCursor::setPosition((int)in_stack_fffffffffffffed0,MVar6);
                  setCursorPosition((QWidgetTextControlPrivate *)
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                    (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                                    (MoveMode)in_stack_fffffffffffffec0);
                }
              }
              local_84.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
                   (QFlagsStorage<Qt::TextInteractionFlag>)
                   QFlags<Qt::TextInteractionFlag>::operator&
                             ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffffec0,edge);
              IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
              if (IVar7 != 0) {
                setClipboardSelection(in_stack_fffffffffffffed0);
                selectionChanged(this_00,(bool)forceEmitSelectionChanged);
              }
            }
          }
        }
      }
    }
    QTextCursor::~QTextCursor((QTextCursor *)&local_30);
  }
  else {
    QWidgetTextControl::setTextCursor
              (in_stack_fffffffffffffee8,
               (QTextCursor *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::extendWordwiseSelection(int suggestedNewPosition, qreal mouseXPosition)
{
    Q_Q(QWidgetTextControl);

    // if inside the initial selected word keep that
    if (suggestedNewPosition >= selectedWordOnDoubleClick.selectionStart()
        && suggestedNewPosition <= selectedWordOnDoubleClick.selectionEnd()) {
        q->setTextCursor(selectedWordOnDoubleClick);
        return;
    }

    QTextCursor curs = selectedWordOnDoubleClick;
    curs.setPosition(suggestedNewPosition, QTextCursor::KeepAnchor);

    if (!curs.movePosition(QTextCursor::StartOfWord))
        return;
    const int wordStartPos = curs.position();

    const int blockPos = curs.block().position();
    const QPointF blockCoordinates = q->blockBoundingRect(curs.block()).topLeft();

    QTextLine line = currentTextLine(curs);
    if (!line.isValid())
        return;

    const qreal wordStartX = line.cursorToX(curs.position() - blockPos) + blockCoordinates.x();

    if (!curs.movePosition(QTextCursor::EndOfWord))
        return;
    const int wordEndPos = curs.position();

    const QTextLine otherLine = currentTextLine(curs);
    if (otherLine.textStart() != line.textStart()
        || wordEndPos == wordStartPos)
        return;

    const qreal wordEndX = line.cursorToX(curs.position() - blockPos) + blockCoordinates.x();

    if (!wordSelectionEnabled && (mouseXPosition < wordStartX || mouseXPosition > wordEndX))
        return;

    if (wordSelectionEnabled) {
        if (suggestedNewPosition < selectedWordOnDoubleClick.position()) {
            cursor.setPosition(selectedWordOnDoubleClick.selectionEnd());
            setCursorPosition(wordStartPos, QTextCursor::KeepAnchor);
        } else {
            cursor.setPosition(selectedWordOnDoubleClick.selectionStart());
            setCursorPosition(wordEndPos, QTextCursor::KeepAnchor);
        }
    } else {
        // keep the already selected word even when moving to the left
        // (#39164)
        if (suggestedNewPosition < selectedWordOnDoubleClick.position())
            cursor.setPosition(selectedWordOnDoubleClick.selectionEnd());
        else
            cursor.setPosition(selectedWordOnDoubleClick.selectionStart());

        const qreal differenceToStart = mouseXPosition - wordStartX;
        const qreal differenceToEnd = wordEndX - mouseXPosition;

        if (differenceToStart < differenceToEnd)
            setCursorPosition(wordStartPos, QTextCursor::KeepAnchor);
        else
            setCursorPosition(wordEndPos, QTextCursor::KeepAnchor);
    }

    if (interactionFlags & Qt::TextSelectableByMouse) {
#ifndef QT_NO_CLIPBOARD
        setClipboardSelection();
#endif
        selectionChanged(true);
    }
}